

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O3

int CVodeB(void *cvode_mem,sunrealtype tBout,int itaskB)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  void *cvode_mem_00;
  CVckpntMem pCVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  char *msgfmt;
  CVckpntMemRec *ck_mem;
  double dVar10;
  double dVar11;
  sunrealtype tBret;
  sunrealtype local_38;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    iVar6 = -0x15;
    iVar7 = 0x565;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar6 = -0x65;
    iVar7 = 0x570;
  }
  else {
    pdVar3 = *(double **)((long)cvode_mem + 0xa70);
    if (*(int *)(pdVar3 + 7) == 0) {
      msgfmt = "No backward problems have been defined yet.";
      iVar6 = -0x67;
      iVar7 = 0x57a;
    }
    else if (*(int *)(pdVar3 + 2) == 0) {
      dVar9 = *pdVar3;
      dVar8 = pdVar3[1];
      dVar4 = pdVar3[6];
      iVar6 = (uint)(dVar9 < dVar8) * 2 + -1;
      if (*(int *)(pdVar3 + 9) != 0) {
        if (dVar4 != 0.0) {
          dVar10 = (double)iVar6;
          dVar11 = dVar4;
          do {
            dVar2 = *(double *)(*(long *)((long)dVar11 + 0x10) + 0x408);
            if (((dVar2 - dVar9) * dVar10 < 0.0) || ((dVar8 - dVar2) * dVar10 < 0.0)) {
              msgfmt = 
              "The initial time tB0 for problem %d is outside the interval over which the forward problem was solved."
              ;
              iVar6 = -0x68;
              iVar7 = 0x59b;
              goto LAB_001109f9;
            }
            if ((dVar2 - tBout) * dVar10 <= 0.0) {
              msgfmt = 
              "The final time tBout is outside the interval over which the forward problem was solved."
              ;
              iVar6 = -0x16;
              iVar7 = 0x5a3;
              goto LAB_001109f9;
            }
            if ((*(int *)((long)dVar11 + 0x18) != 0) || (*(int *)((long)dVar11 + 0x1c) != 0)) {
              *(undefined4 *)((long)pdVar3 + 0xbc) = 1;
            }
            dVar11 = *(double *)((long)dVar11 + 0x78);
          } while (dVar11 != 0.0);
        }
        if ((*(int *)((long)pdVar3 + 0xbc) != 0) && (*(int *)(pdVar3 + 0x17) == 0)) {
          msgfmt = 
          "At least one backward problem requires sensitivities, but they were not stored for interpolation."
          ;
          iVar6 = -0x16;
          iVar7 = 0x5b3;
          goto LAB_001109f9;
        }
        *(undefined4 *)(pdVar3 + 9) = 0;
      }
      if (itaskB - 3U < 0xfffffffe) {
        msgfmt = "Illegal value for itaskB. Legal values are CV_NORMAL and CV_ONE_STEP.";
        iVar6 = -0x16;
        iVar7 = 0x5c0;
      }
      else {
        dVar10 = (double)iVar6;
        dVar11 = tBout - dVar9;
        if (0.0 <= dVar11 * dVar10) {
          if (0.0 <= (dVar8 - tBout) * dVar10) goto LAB_00110bd9;
        }
        else {
          tBout = dVar9;
          if (ABS(dVar11) < (ABS(dVar8) + ABS(dVar9)) * *(double *)((long)cvode_mem + 8) * 100.0) {
LAB_00110bd9:
            pCVar5 = (CVckpntMem)pdVar3[10];
            do {
              ck_mem = pCVar5;
              if (dVar4 != 0.0) {
                dVar9 = ck_mem->ck_t0;
                dVar8 = dVar4;
                do {
                  dVar11 = *(double *)(*(long *)((long)dVar8 + 0x10) + 0x408);
                  if (0.0 < (dVar11 - dVar9) * dVar10) goto LAB_00110c44;
                  if (itaskB == 1) {
                    if (((dVar11 == dVar9) && (!NAN(dVar11) && !NAN(dVar9))) &&
                       (0.0 <= (tBout - dVar9) * dVar10)) goto LAB_00110c44;
                  }
                  dVar8 = *(double *)((long)dVar8 + 0x78);
                } while (dVar8 != 0.0);
              }
              pCVar5 = ck_mem->ck_next;
            } while (ck_mem->ck_next != (CVckpntMemRec *)0x0);
LAB_00110c44:
            iVar6 = 0;
            do {
              if (ck_mem != (CVckpntMem)pdVar3[0xc]) {
                iVar7 = CVAdataStore((CVodeMem)cvode_mem,ck_mem);
                iVar6 = 0;
                if (iVar7 != 0) {
                  return iVar7;
                }
              }
              dVar9 = dVar4;
              if (dVar4 == 0.0) {
                return iVar6;
              }
              do {
                cvode_mem_00 = *(void **)((long)dVar9 + 0x10);
                dVar8 = *(double *)((long)cvode_mem_00 + 0x408);
                dVar11 = ck_mem->ck_t0;
                if ((((dVar8 == dVar11) && (!NAN(dVar8) && !NAN(dVar11))) &&
                    ((tBout - dVar11) * dVar10 < 0.0)) ||
                   ((itaskB == 2 && dVar8 == dVar11 || ((dVar8 - dVar11) * dVar10 < 0.0)))) {
                  *(double *)((long)dVar9 + 0x68) = dVar8;
                  iVar6 = 0;
                }
                else {
                  pdVar3[8] = dVar9;
                  CVodeSetStopTime(cvode_mem_00,dVar11);
                  iVar6 = CVode(*(void **)((long)dVar9 + 0x10),tBout,
                                *(N_Vector *)((long)dVar9 + 0x70),&local_38,itaskB);
                  *(sunrealtype *)((long)dVar9 + 0x68) = local_38;
                  if (iVar6 < 0) {
                    msgfmt = "Error occurred while integrating backward problem # %d";
                    iVar7 = 0x646;
                    goto LAB_001109f9;
                  }
                }
                dVar9 = *(double *)((long)dVar9 + 0x78);
              } while (dVar9 != 0.0);
              dVar9 = dVar4;
              if (itaskB == 2 || dVar4 == 0.0) {
                return iVar6;
              }
              while ((*(double *)((long)dVar9 + 0x68) - tBout) * dVar10 <= 0.0) {
                pdVar1 = (double *)((long)dVar9 + 0x78);
                dVar9 = *pdVar1;
                if (*pdVar1 == 0.0) {
                  return iVar6;
                }
              }
              ck_mem = ck_mem->ck_next;
            } while( true );
          }
        }
        msgfmt = 
        "The final time tBout is outside the interval over which the forward problem was solved.";
        iVar6 = -0x16;
        iVar7 = 0x5d4;
      }
    }
    else {
      msgfmt = "Illegal attempt to call before calling CVodeF.";
      iVar6 = -0x66;
      iVar7 = 0x584;
    }
  }
LAB_001109f9:
  cvProcessError((CVodeMem)cvode_mem,iVar6,iVar7,"CVodeB",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                 ,msgfmt);
  return iVar6;
}

Assistant:

int CVodeB(void* cvode_mem, sunrealtype tBout, int itaskB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem, tmp_cvB_mem;
  CVckpntMem ck_mem;
  int sign, flag = 0;
  sunrealtype tfuzz, tBret, tBn;
  sunbooleantype gotCheckpoint, isActive, reachedTBout;

  /* Check if cvode_mem exists */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Was ASA initialized? */

  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check if any backward problem has been defined */

  if (ca_mem->ca_nbckpbs == 0)
  {
    cvProcessError(cv_mem, CV_NO_BCK, __LINE__, __func__, __FILE__, MSGCV_NO_BCK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_BCK);
  }
  cvB_mem = ca_mem->cvB_mem;

  /* Check whether CVodeF has been called */

  if (ca_mem->ca_firstCVodeFcall)
  {
    cvProcessError(cv_mem, CV_NO_FWD, __LINE__, __func__, __FILE__, MSGCV_NO_FWD);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_FWD);
  }
  sign = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* If this is the first call, loop over all backward problems and
   *   - check that tB0 is valid
   *   - check that tBout is ahead of tB0 in the backward direction
   *   - check whether we need to interpolate forward sensitivities
   */

  if (ca_mem->ca_firstCVodeBcall)
  {
    tmp_cvB_mem = cvB_mem;

    while (tmp_cvB_mem != NULL)
    {
      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if ((sign * (tBn - ca_mem->ca_tinitial) < ZERO) ||
          (sign * (ca_mem->ca_tfinal - tBn) < ZERO))
      {
        cvProcessError(cv_mem, CV_BAD_TB0, __LINE__, __func__, __FILE__,
                       MSGCV_BAD_TB0, tmp_cvB_mem->cv_index);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return (CV_BAD_TB0);
      }

      if (sign * (tBn - tBout) <= ZERO)
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       MSGCV_BAD_TBOUT, tmp_cvB_mem->cv_index);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return (CV_ILL_INPUT);
      }

      if (tmp_cvB_mem->cv_f_withSensi || tmp_cvB_mem->cv_fQ_withSensi)
      {
        ca_mem->ca_IMinterpSensi = SUNTRUE;
      }

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (ca_mem->ca_IMinterpSensi && !ca_mem->ca_IMstoreSensi)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_SENSI);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (CV_ILL_INPUT);
    }

    ca_mem->ca_firstCVodeBcall = SUNFALSE;
  }

  /* Check if itaskB is legal */

  if ((itaskB != CV_NORMAL) && (itaskB != CV_ONE_STEP))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ITASKB);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Check if tBout is legal */

  if ((sign * (tBout - ca_mem->ca_tinitial) < ZERO) ||
      (sign * (ca_mem->ca_tfinal - tBout) < ZERO))
  {
    tfuzz = HUNDRED * cv_mem->cv_uround *
            (SUNRabs(ca_mem->ca_tinitial) + SUNRabs(ca_mem->ca_tfinal));
    if ((sign * (tBout - ca_mem->ca_tinitial) < ZERO) &&
        (SUNRabs(tBout - ca_mem->ca_tinitial) < tfuzz))
    {
      tBout = ca_mem->ca_tinitial;
    }
    else
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_TBOUT);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (CV_ILL_INPUT);
    }
  }

  /* Loop through the check points and stop as soon as a backward
   * problem has its tn value behind the current check point's t0_
   * value (in the backward direction) */

  ck_mem = ca_mem->ck_mem;

  gotCheckpoint = SUNFALSE;

  for (;;)
  {
    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if (sign * (tBn - ck_mem->ck_t0) > ZERO)
      {
        gotCheckpoint = SUNTRUE;
        break;
      }

      if ((itaskB == CV_NORMAL) && (tBn == ck_mem->ck_t0) &&
          (sign * (tBout - ck_mem->ck_t0) >= ZERO))
      {
        gotCheckpoint = SUNTRUE;
        break;
      }

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (gotCheckpoint) { break; }

    if (ck_mem->ck_next == NULL) { break; }

    ck_mem = ck_mem->ck_next;
  }

  /* Starting with the current check point from above, loop over check points
     while propagating backward problems */

  for (;;)
  {
    /* Store interpolation data if not available.
       This is the 2nd forward integration pass */

    if (ck_mem != ca_mem->ca_ckpntData)
    {
      flag = CVAdataStore(cv_mem, ck_mem);
      if (flag != CV_SUCCESS) { break; }
    }

    /* Loop through all backward problems and, if needed,
     * propagate their solution towards tBout */

    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      /* Decide if current backward problem is "active" in this check point */

      isActive = SUNTRUE;

      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if ((tBn == ck_mem->ck_t0) && (sign * (tBout - ck_mem->ck_t0) < ZERO))
      {
        isActive = SUNFALSE;
      }
      if ((tBn == ck_mem->ck_t0) && (itaskB == CV_ONE_STEP))
      {
        isActive = SUNFALSE;
      }

      if (sign * (tBn - ck_mem->ck_t0) < ZERO) { isActive = SUNFALSE; }

      if (isActive)
      {
        /* Store the address of current backward problem memory
         * in ca_mem to be used in the wrapper functions */
        ca_mem->ca_bckpbCrt = tmp_cvB_mem;

        /* Integrate current backward problem */
        CVodeSetStopTime(tmp_cvB_mem->cv_mem, ck_mem->ck_t0);
        flag = CVode(tmp_cvB_mem->cv_mem, tBout, tmp_cvB_mem->cv_y, &tBret,
                     itaskB);

        /* Set the time at which we will report solution and/or quadratures */
        tmp_cvB_mem->cv_tout = tBret;

        /* If an error occurred, exit while loop */
        if (flag < 0) { break; }
      }
      else
      {
        flag                 = CV_SUCCESS;
        tmp_cvB_mem->cv_tout = tBn;
      }

      /* Move to next backward problem */

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    /* If an error occurred, return now */

    if (flag < 0)
    {
      cvProcessError(cv_mem, flag, __LINE__, __func__, __FILE__,
                     MSGCV_BACK_ERROR, tmp_cvB_mem->cv_index);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (flag);
    }

    /* If in CV_ONE_STEP mode, return now (flag = CV_SUCCESS) */

    if (itaskB == CV_ONE_STEP) { break; }

    /* If all backward problems have successfully reached tBout, return now */

    reachedTBout = SUNTRUE;

    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      if (sign * (tmp_cvB_mem->cv_tout - tBout) > ZERO)
      {
        reachedTBout = SUNFALSE;
        break;
      }
      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (reachedTBout) { break; }

    /* Move check point in linked list to next one */

    ck_mem = ck_mem->ck_next;
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (flag);
}